

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

string * __thiscall Message::str_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"o=");
  poVar1 = std::operator<<(poVar1,(string *)&this->o);
  poVar1 = std::operator<<(poVar1,", t=");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1,", v=");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", n=");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", c=");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->c);
  poVar1 = std::operator<<(poVar1,", d=");
  poVar1 = std::operator<<(poVar1,(string *)&this->d);
  std::operator<<(poVar1,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string Message::str() const{
    std::stringstream ss;
    ss
        <<"o="<<o
        <<", t="<<t
        <<", v="<<v
        <<", n="<<n
        <<", c="<<c
        <<", d="<<d
        <<")";
    return ss.str();
}